

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O3

_Bool run_bitset_container_intersection
                (run_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint16_t *puVar4;
  int iVar5;
  uint uVar6;
  array_container_t *paVar7;
  bitset_container_t *pbVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  int32_t iVar12;
  long lVar13;
  uint32_t runValue;
  int iVar14;
  uint64_t *puVar15;
  uint uVar16;
  
  if (((src_1->n_runs == 1) && (src_1->runs->value == 0)) && (src_1->runs->length == 0xffff)) {
    if ((bitset_container_t *)*dst != src_2) {
      pbVar8 = bitset_container_clone(src_2);
      *dst = pbVar8;
      return true;
    }
    return true;
  }
  iVar5 = run_container_cardinality(src_1);
  if (iVar5 < 0x1001) {
    iVar14 = src_2->cardinality;
    if (iVar5 < src_2->cardinality) {
      iVar14 = iVar5;
    }
    paVar7 = array_container_create_given_capacity(iVar14);
    *dst = paVar7;
    if (paVar7 == (array_container_t *)0x0) {
      return false;
    }
    iVar5 = src_1->n_runs;
    if ((long)iVar5 < 1) {
      return false;
    }
    prVar3 = src_1->runs;
    puVar4 = paVar7->array;
    puVar15 = src_2->words;
    iVar12 = paVar7->cardinality;
    lVar13 = 0;
    do {
      uVar11 = (ulong)prVar3[lVar13].value;
      iVar14 = prVar3[lVar13].length + 1;
      do {
        puVar4[iVar12] = (uint16_t)uVar11;
        iVar12 = iVar12 + (uint)((*(ulong *)((long)puVar15 + (ulong)((uint)(uVar11 >> 3) & 0x1ff8))
                                  >> (uVar11 & 0x3f) & 1) != 0);
        uVar11 = (ulong)((int)uVar11 + 1);
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
      lVar13 = lVar13 + 1;
    } while (lVar13 != iVar5);
    paVar7->cardinality = iVar12;
    return false;
  }
  pbVar8 = (bitset_container_t *)*dst;
  if (pbVar8 == src_2) {
    iVar5 = src_1->n_runs;
    if ((long)iVar5 < 1) {
      puVar15 = src_2->words;
      *puVar15 = 0;
      uVar10 = 0;
      uVar16 = 0;
LAB_0011b663:
      memset((void *)((long)puVar15 + (ulong)(uVar10 >> 3 & 0x1ff8) + 8),0,
             (ulong)(uVar16 * -8 + 0x1fe8) + 8);
      uVar11 = 0xffffffffffffffff;
    }
    else {
      prVar3 = src_1->runs;
      puVar15 = src_2->words;
      lVar13 = 0;
      uVar10 = 0;
      do {
        uVar1 = prVar3[lVar13].value;
        uVar2 = prVar3[lVar13].length;
        if (uVar10 != uVar1) {
          uVar6 = uVar10 >> 6;
          uVar11 = -1L << ((byte)uVar10 & 0x3f);
          uVar16 = uVar1 - 1 >> 6;
          if (uVar16 - uVar6 == 0) {
            bVar9 = -(char)uVar1;
            uVar11 = (uVar11 << (bVar9 & 0x3f)) >> (bVar9 & 0x3f);
            uVar16 = uVar6;
          }
          else {
            puVar15[uVar6] = puVar15[uVar6] & ~uVar11;
            if (uVar6 + 1 < uVar16) {
              memset(puVar15 + (ulong)uVar6 + 1,0,(ulong)((uVar16 - uVar6) - 2) * 8 + 8);
            }
            uVar11 = 0xffffffffffffffff >> (-(char)uVar1 & 0x3fU);
          }
          puVar15[uVar16] = puVar15[uVar16] & ~uVar11;
        }
        uVar10 = (uint)uVar1 + (uint)uVar2 + 1;
        lVar13 = lVar13 + 1;
      } while (iVar5 != lVar13);
      if (uVar10 == 0x10000) goto LAB_0011b69a;
      uVar16 = uVar10 >> 6;
      uVar11 = -1L << ((byte)uVar10 & 0x3f);
      if ((uVar16 != 0x3ff) &&
         (puVar15[uVar16] = puVar15[uVar16] & ~uVar11, uVar11 = 0xffffffffffffffff, uVar10 < 0xff80)
         ) goto LAB_0011b663;
    }
    puVar15[0x3ff] = puVar15[0x3ff] & ~uVar11;
LAB_0011b69a:
    iVar5 = bitset_container_compute_cardinality(pbVar8);
    pbVar8->cardinality = iVar5;
    if (src_2->cardinality < 0x1001) {
      paVar7 = array_container_from_bitset(src_2);
      *dst = paVar7;
      return false;
    }
    return true;
  }
  pbVar8 = bitset_container_clone(src_2);
  *dst = pbVar8;
  if (pbVar8 == (bitset_container_t *)0x0) {
    return true;
  }
  iVar5 = src_1->n_runs;
  if ((long)iVar5 < 1) {
    puVar15 = pbVar8->words;
    *puVar15 = 0;
    uVar10 = 0;
    uVar16 = 0;
LAB_0011b5ee:
    memset((void *)((long)puVar15 + (ulong)(uVar10 >> 3 & 0x1ff8) + 8),0,
           (ulong)(uVar16 * -8 + 0x1fe8) + 8);
    uVar11 = 0xffffffffffffffff;
  }
  else {
    prVar3 = src_1->runs;
    puVar15 = pbVar8->words;
    lVar13 = 0;
    uVar10 = 0;
    do {
      uVar1 = prVar3[lVar13].value;
      uVar2 = prVar3[lVar13].length;
      if (uVar10 != uVar1) {
        uVar6 = uVar10 >> 6;
        uVar11 = -1L << ((byte)uVar10 & 0x3f);
        uVar16 = uVar1 - 1 >> 6;
        if (uVar16 - uVar6 == 0) {
          bVar9 = -(char)uVar1;
          uVar11 = (uVar11 << (bVar9 & 0x3f)) >> (bVar9 & 0x3f);
          uVar16 = uVar6;
        }
        else {
          puVar15[uVar6] = puVar15[uVar6] & ~uVar11;
          if (uVar6 + 1 < uVar16) {
            memset(puVar15 + (ulong)uVar6 + 1,0,(ulong)((uVar16 - uVar6) - 2) * 8 + 8);
          }
          uVar11 = 0xffffffffffffffff >> (-(char)uVar1 & 0x3fU);
        }
        puVar15[uVar16] = puVar15[uVar16] & ~uVar11;
      }
      uVar10 = (uint)uVar1 + (uint)uVar2 + 1;
      lVar13 = lVar13 + 1;
    } while (iVar5 != lVar13);
    if (uVar10 == 0x10000) goto LAB_0011b625;
    uVar16 = uVar10 >> 6;
    uVar11 = -1L << ((byte)uVar10 & 0x3f);
    if ((uVar16 != 0x3ff) &&
       (puVar15[uVar16] = puVar15[uVar16] & ~uVar11, uVar11 = 0xffffffffffffffff, uVar10 < 0xff80))
    goto LAB_0011b5ee;
  }
  puVar15[0x3ff] = puVar15[0x3ff] & ~uVar11;
LAB_0011b625:
  iVar5 = bitset_container_compute_cardinality(pbVar8);
  pbVar8->cardinality = iVar5;
  if (iVar5 < 0x1001) {
    paVar7 = array_container_from_bitset(pbVar8);
    bitset_container_free((bitset_container_t *)*dst);
    *dst = paVar7;
    return false;
  }
  return true;
}

Assistant:

bool run_bitset_container_intersection(const run_container_t *src_1,
                                       const bitset_container_t *src_2,
                                       container_t **dst) {
    if (run_container_is_full(src_1)) {
        if (*dst != src_2) *dst = bitset_container_clone(src_2);
        return true;
    }
    int32_t card = run_container_cardinality(src_1);
    if (card <= DEFAULT_MAX_SIZE) {
        // result can only be an array (assuming that we never make a
        // RunContainer)
        if (card > src_2->cardinality) {
            card = src_2->cardinality;
        }
        array_container_t *answer = array_container_create_given_capacity(card);
        *dst = answer;
        if (*dst == NULL) {
            return false;
        }
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];
            uint32_t endofrun = (uint32_t)rle.value + rle.length;
            for (uint32_t runValue = rle.value; runValue <= endofrun;
                 ++runValue) {
                answer->array[answer->cardinality] = (uint16_t)runValue;
                answer->cardinality +=
                    bitset_container_contains(src_2, runValue);
            }
        }
        return false;
    }
    if (*dst == src_2) {  // we attempt in-place
        bitset_container_t *answer = CAST_bitset(*dst);
        uint32_t start = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            const rle16_t rle = src_1->runs[rlepos];
            uint32_t end = rle.value;
            bitset_reset_range(src_2->words, start, end);

            start = end + rle.length + 1;
        }
        bitset_reset_range(src_2->words, start, UINT32_C(1) << 16);
        answer->cardinality = bitset_container_compute_cardinality(answer);
        if (src_2->cardinality > DEFAULT_MAX_SIZE) {
            return true;
        } else {
            array_container_t *newanswer = array_container_from_bitset(src_2);
            if (newanswer == NULL) {
                *dst = NULL;
                return false;
            }
            *dst = newanswer;
            return false;
        }
    } else {  // no inplace
        // we expect the answer to be a bitmap (if we are lucky)
        bitset_container_t *answer = bitset_container_clone(src_2);

        *dst = answer;
        if (answer == NULL) {
            return true;
        }
        uint32_t start = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            const rle16_t rle = src_1->runs[rlepos];
            uint32_t end = rle.value;
            bitset_reset_range(answer->words, start, end);
            start = end + rle.length + 1;
        }
        bitset_reset_range(answer->words, start, UINT32_C(1) << 16);
        answer->cardinality = bitset_container_compute_cardinality(answer);

        if (answer->cardinality > DEFAULT_MAX_SIZE) {
            return true;
        } else {
            array_container_t *newanswer = array_container_from_bitset(answer);
            bitset_container_free(CAST_bitset(*dst));
            if (newanswer == NULL) {
                *dst = NULL;
                return false;
            }
            *dst = newanswer;
            return false;
        }
    }
}